

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

int __thiscall kwssys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  RegExpFind *pRVar5;
  size_t __n;
  char *pcVar6;
  RegExpFind *p;
  RegExpFind *in_RSI;
  long *in_RDI;
  bool bVar7;
  int min_no;
  char *save_3;
  int no_2;
  char nextch;
  char *save_2;
  char *save_1;
  int no_1;
  char *save;
  int no;
  char *opnd;
  size_t len;
  char *next;
  char *scan;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint uVar8;
  char cVar9;
  
  p = in_RSI;
  do {
    if (p == (RegExpFind *)0x0) {
      printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
      return 0;
    }
    pRVar5 = (RegExpFind *)regnext((char *)p);
    switch(*(char *)&p->reginput) {
    case '\0':
      return 1;
    case '\x01':
      p = pRVar5;
      if (*in_RDI != in_RDI[1]) {
        return 0;
      }
      break;
    case '\x02':
      p = pRVar5;
      if (*(char *)*in_RDI != '\0') {
        return 0;
      }
      break;
    case '\x03':
      if (*(char *)*in_RDI == '\0') {
        return 0;
      }
      *in_RDI = *in_RDI + 1;
      p = pRVar5;
      break;
    case '\x04':
      if ((*(char *)*in_RDI == '\0') ||
         (pcVar6 = strchr((char *)((long)&p->reginput + 3),(int)*(char *)*in_RDI),
         pcVar6 == (char *)0x0)) {
        return 0;
      }
      *in_RDI = *in_RDI + 1;
      p = pRVar5;
      break;
    case '\x05':
      if ((*(char *)*in_RDI == '\0') ||
         (pcVar6 = strchr((char *)((long)&p->reginput + 3),(int)*(char *)*in_RDI),
         pcVar6 != (char *)0x0)) {
        return 0;
      }
      *in_RDI = *in_RDI + 1;
      p = pRVar5;
      break;
    case '\x06':
      if (*(char *)&pRVar5->reginput == '\x06') {
        do {
          lVar2 = *in_RDI;
          iVar3 = regmatch(in_RSI,(char *)p);
          if (iVar3 != 0) {
            return 1;
          }
          *in_RDI = lVar2;
          p = (RegExpFind *)regnext((char *)p);
          bVar7 = false;
          if (p != (RegExpFind *)0x0) {
            bVar7 = *(char *)&p->reginput == '\x06';
          }
        } while (bVar7);
        return 0;
      }
      p = (RegExpFind *)((long)&p->reginput + 3);
      break;
    case '\a':
      p = pRVar5;
      break;
    case '\b':
      pcVar6 = (char *)((long)&p->reginput + 3);
      if (*pcVar6 != *(char *)*in_RDI) {
        return 0;
      }
      __n = strlen(pcVar6);
      if ((1 < __n) && (iVar3 = strncmp(pcVar6,(char *)*in_RDI,__n), iVar3 != 0)) {
        return 0;
      }
      *in_RDI = __n + *in_RDI;
      p = pRVar5;
      break;
    case '\t':
      p = pRVar5;
      break;
    case '\n':
    case '\v':
      uVar8 = in_stack_ffffffffffffff9c & 0xffffff;
      if (*(char *)&pRVar5->reginput == '\b') {
        uVar8 = CONCAT13(*(char *)((long)&pRVar5->reginput + 3),(int3)in_stack_ffffffffffffff9c);
      }
      cVar1 = *(char *)&p->reginput;
      pcVar6 = (char *)*in_RDI;
      iVar3 = regrepeat((RegExpFind *)CONCAT44(uVar8,in_stack_ffffffffffffff98),pcVar6);
      while( true ) {
        if (iVar3 < (int)(uint)(cVar1 != '\n')) {
          return 0;
        }
        cVar9 = (char)(uVar8 >> 0x18);
        if (((cVar9 == '\0') || (*(char *)*in_RDI == cVar9)) &&
           (iVar4 = regmatch(in_RSI,(char *)p), iVar4 != 0)) break;
        iVar3 = iVar3 + -1;
        *in_RDI = (long)(pcVar6 + iVar3);
      }
      return 1;
    default:
      printf("RegularExpression::find(): Internal error -- memory corrupted.\n");
      return 0;
    case '\x15':
    case '\x16':
    case '\x17':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
    case '\x1c':
    case '\x1d':
    case '\x1e':
    case '\x1f':
    case ' ':
    case '!':
    case '\"':
    case '#':
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case '-':
    case '.':
    case '/':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
      iVar3 = *(char *)&p->reginput + -0x14;
      lVar2 = *in_RDI;
      iVar4 = regmatch(in_RSI,(char *)p);
      if (iVar4 != 0) {
        if (*(long *)(in_RDI[2] + (long)iVar3 * 8) == 0) {
          *(long *)(in_RDI[2] + (long)iVar3 * 8) = lVar2;
        }
        return 1;
      }
      return 0;
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
      iVar3 = *(char *)&p->reginput + -0x34;
      lVar2 = *in_RDI;
      iVar4 = regmatch(in_RSI,(char *)p);
      if (iVar4 != 0) {
        if (*(long *)(in_RDI[3] + (long)iVar3 * 8) == 0) {
          *(long *)(in_RDI[3] + (long)iVar3 * 8) = lVar2;
        }
        return 1;
      }
      return 0;
    }
  } while( true );
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != nullptr) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == nullptr)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != nullptr)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9:
      case OPEN + 10:
      case OPEN + 11:
      case OPEN + 12:
      case OPEN + 13:
      case OPEN + 14:
      case OPEN + 15:
      case OPEN + 16:
      case OPEN + 17:
      case OPEN + 18:
      case OPEN + 19:
      case OPEN + 20:
      case OPEN + 21:
      case OPEN + 22:
      case OPEN + 23:
      case OPEN + 24:
      case OPEN + 25:
      case OPEN + 26:
      case OPEN + 27:
      case OPEN + 28:
      case OPEN + 29:
      case OPEN + 30:
      case OPEN + 31:
      case OPEN + 32: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == nullptr)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9:
      case CLOSE + 10:
      case CLOSE + 11:
      case CLOSE + 12:
      case CLOSE + 13:
      case CLOSE + 14:
      case CLOSE + 15:
      case CLOSE + 16:
      case CLOSE + 17:
      case CLOSE + 18:
      case CLOSE + 19:
      case CLOSE + 20:
      case CLOSE + 21:
      case CLOSE + 22:
      case CLOSE + 23:
      case CLOSE + 24:
      case CLOSE + 25:
      case CLOSE + 26:
      case CLOSE + 27:
      case CLOSE + 28:
      case CLOSE + 29:
      case CLOSE + 30:
      case CLOSE + 31:
      case CLOSE + 32: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == nullptr)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != nullptr && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}